

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObservation.cpp
# Opt level: O0

bool __thiscall test_CEObservation::runtests(test_CEObservation *this)

{
  byte bVar1;
  long *in_RDI;
  test_CEObservation *in_stack_00000430;
  test_CEObservation *in_stack_000004e0;
  test_CEObservation *in_stack_000005d0;
  
  std::operator<<((ostream *)&std::cout,"\nTesting CEObservation:\n");
  test_constructor(in_stack_000004e0);
  test_obj_return(in_stack_00000430);
  test_cache(in_stack_000005d0);
  bVar1 = (**(code **)(*in_RDI + 0x18))();
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CEObservation::runtests()
{
    std::cout << "\nTesting CEObservation:\n";

    // Run each of the tests
    test_constructor();
    test_obj_return();
    test_cache();

    return pass();
}